

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ClockingAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ClockingAssertionExpr,slang::ast::TimingControl&,slang::ast::AssertionExpr&>
          (BumpAllocator *this,TimingControl *args,AssertionExpr *args_1)

{
  ClockingAssertionExpr *pCVar1;
  
  pCVar1 = (ClockingAssertionExpr *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ClockingAssertionExpr *)this->endPtr < pCVar1 + 1) {
    pCVar1 = (ClockingAssertionExpr *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pCVar1 + 1);
  }
  (pCVar1->super_AssertionExpr).kind = Clocking;
  (pCVar1->super_AssertionExpr).syntax = (SyntaxNode *)0x0;
  pCVar1->clocking = args;
  pCVar1->expr = args_1;
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }